

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilSort.c
# Opt level: O0

int * Abc_MergeSortCost(int *pCosts,int nSize)

{
  int *piVar1;
  int *pInBeg;
  int *pOutBeg;
  int *pOutput;
  int *pInput;
  int *pResult;
  int i;
  int nSize_local;
  int *pCosts_local;
  
  piVar1 = (int *)calloc(4,(long)nSize);
  if (1 < nSize) {
    pInBeg = (int *)malloc((long)nSize << 3);
    pOutBeg = (int *)malloc((long)nSize << 3);
    for (pResult._0_4_ = 0; (int)pResult < nSize; pResult._0_4_ = (int)pResult + 1) {
      pInBeg[(int)pResult << 1] = (int)pResult;
      pInBeg[(int)pResult * 2 + 1] = pCosts[(int)pResult];
    }
    Abc_MergeSortCost_rec(pInBeg,pInBeg + (nSize << 1),pOutBeg);
    for (pResult._0_4_ = 0; (int)pResult < nSize; pResult._0_4_ = (int)pResult + 1) {
      piVar1[(int)pResult] = pInBeg[(int)pResult << 1];
    }
    free(pOutBeg);
    free(pInBeg);
  }
  return piVar1;
}

Assistant:

int * Abc_MergeSortCost( int * pCosts, int nSize )
{
    int i, * pResult, * pInput, * pOutput;
    pResult = (int *) calloc( sizeof(int), nSize );
    if ( nSize < 2 )
        return pResult;
    pInput  = (int *) malloc( sizeof(int) * 2 * nSize );
    pOutput = (int *) malloc( sizeof(int) * 2 * nSize );
    for ( i = 0; i < nSize; i++ )
        pInput[2*i] = i, pInput[2*i+1] = pCosts[i];
    Abc_MergeSortCost_rec( pInput, pInput + 2*nSize, pOutput );
    for ( i = 0; i < nSize; i++ )
        pResult[i] = pInput[2*i];
    free( pOutput );
    free( pInput );
    return pResult;
}